

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<signed_char,_unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase1
               (uchar lhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_RDX;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_SIL;
  byte in_DIL;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  char in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  char local_11;
  
  cVar1 = ::SafeInt::operator_cast_to_signed_char
                    ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT24(in_stack_ffffffffffffffe4,
                                                   in_stack_ffffffffffffffe0))));
  if (cVar1 < '\x01') {
    cVar1 = ::SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_ffffffffffffffe7,
                                   CONCAT16(in_stack_ffffffffffffffe6,
                                            CONCAT24(in_stack_ffffffffffffffe4,
                                                     in_stack_ffffffffffffffe0))));
    if (cVar1 == '\0') {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
    }
    bVar2 = DivisionNegativeCornerCaseHelper<signed_char,_unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::NegativeCornerCase(in_DIL,in_SIL,in_RDX);
    if (!bVar2) {
      uVar3 = (uint)in_DIL;
      cVar1 = ::SafeInt::operator_cast_to_signed_char
                        ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT17(in_SIL.m_int,
                                     CONCAT16(in_stack_ffffffffffffffe6,
                                              CONCAT24(in_stack_ffffffffffffffe4,
                                                       in_stack_ffffffffffffffe0))));
      SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT17(in_SIL.m_int,
                               CONCAT16(in_stack_ffffffffffffffe6,
                                        CONCAT24(in_stack_ffffffffffffffe4,(int)uVar3 / (int)cVar1))
                              ),(int *)CONCAT44(in_stack_ffffffffffffffdc,uVar3));
      in_RDX->m_int = in_stack_ffffffffffffffe6;
    }
  }
  else {
    uVar3 = (uint)in_DIL;
    ::SafeInt::operator_cast_to_signed_char
              ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT17(in_stack_ffffffffffffffe7,
                           CONCAT16(in_stack_ffffffffffffffe6,
                                    CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))))
    ;
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT17(in_stack_ffffffffffffffe7,
                             CONCAT16(in_stack_ffffffffffffffe6,
                                      CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
                            ),(int *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
    in_RDX->m_int = local_11;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }